

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_3_channels_with_4_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pfVar10 = output_buffer;
  do {
    pfVar1 = decode_buffer + (long)horizontal_contributors->n0 * 3;
    fVar2 = *horizontal_coefficients;
    fVar3 = horizontal_coefficients[1];
    fVar4 = horizontal_coefficients[2];
    fVar5 = horizontal_coefficients[3];
    fVar6 = pfVar1[2];
    fVar7 = pfVar1[3];
    fVar8 = pfVar1[8];
    fVar9 = pfVar1[9];
    fVar11 = fVar4 * pfVar1[6] + *pfVar1 * fVar2 + fVar5 * fVar9 + fVar7 * fVar3;
    fVar12 = fVar4 * pfVar1[7] + pfVar1[1] * fVar2 + fVar5 * pfVar1[10] + fVar3 * pfVar1[4];
    fVar13 = fVar4 * fVar8 + fVar6 * fVar2 + fVar5 * pfVar1[0xb] + fVar3 * pfVar1[5];
    pfVar1 = pfVar10 + 3;
    if (pfVar1 < output_buffer + output_sub_size * 3) {
      *pfVar10 = fVar11;
      pfVar10[1] = fVar12;
      pfVar10[2] = fVar13;
      pfVar10[3] = fVar5 * fVar9 + fVar7 * fVar3 + fVar4 * fVar8 + fVar6 * fVar2;
    }
    else {
      *(ulong *)pfVar10 = CONCAT44(fVar12,fVar11);
      pfVar10[2] = fVar13;
    }
    horizontal_contributors = horizontal_contributors + 1;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    pfVar10 = pfVar1;
  } while (pfVar1 < output_buffer + output_sub_size * 3);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_4_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__store_output();
  } while ( output < output_end );
}